

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyEdge(ON_MeshComponentRef *this,ON_MeshTopologyEdge **tope)

{
  int iVar1;
  int iVar2;
  ON_MeshTopology *pOVar3;
  ON_MeshTopologyEdge *pOVar4;
  ON_MeshTopology *top;
  ON_MeshTopologyEdge **tope_local;
  ON_MeshComponentRef *this_local;
  
  if (((((this->m_mesh_ci).m_type == meshtop_edge) && (-1 < (this->m_mesh_ci).m_index)) &&
      (pOVar3 = MeshTopology(this), pOVar3 != (ON_MeshTopology *)0x0)) &&
     (iVar1 = (this->m_mesh_ci).m_index,
     iVar2 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&pOVar3->m_tope), iVar1 < iVar2)) {
    pOVar4 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[]
                       (&pOVar3->m_tope,(this->m_mesh_ci).m_index);
    *tope = pOVar4;
    this_local._4_4_ = (this->m_mesh_ci).m_index;
  }
  else {
    *tope = (ON_MeshTopologyEdge *)0x0;
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyEdge(
  const struct ON_MeshTopologyEdge*& tope
  ) const
{
  if ( ON_COMPONENT_INDEX::meshtop_edge == m_mesh_ci.m_type && m_mesh_ci.m_index >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( top && m_mesh_ci.m_index < top->m_tope.Count() )
    {
      tope = &top->m_tope[m_mesh_ci.m_index];
      return (unsigned int)m_mesh_ci.m_index;
    }
  }
  tope = 0;
  return ON_UNSET_UINT_INDEX;
}